

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

string * __thiscall
duckdb::StrpTimeFormat::ParseResult::FormatError
          (ParseResult *this,string_t input,string *format_specifier)

{
  long in_RSI;
  string *in_RDI;
  string *in_R8;
  string local_108 [32];
  string_t *in_stack_ffffffffffffff18;
  string local_e0 [32];
  string local_c0 [32];
  string *in_stack_ffffffffffffff60;
  optional_idx in_stack_ffffffffffffff68;
  string local_80 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,
             "Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s",
             (allocator *)&stack0xffffffffffffffb7);
  string_t::GetString_abi_cxx11_(in_stack_ffffffffffffff18);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff60,in_R8);
  string_t::GetString_abi_cxx11_(in_stack_ffffffffffffff18);
  FormatStrpTimeError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::string(local_108,(string *)(in_RSI + 0x40));
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ::std::__cxx11::string::~string(local_108);
  ::std::__cxx11::string::~string(local_c0);
  ::std::__cxx11::string::~string(local_e0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return in_RDI;
}

Assistant:

string StrpTimeFormat::ParseResult::FormatError(string_t input, const string &format_specifier) {
	return StringUtil::Format("Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s",
	                          input.GetString(), format_specifier,
	                          FormatStrpTimeError(input.GetString(), error_position), error_message);
}